

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  void **ppvVar1;
  bool bVar2;
  VkBaseInStructure *base_in_1;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar3;
  VkShaderModule pVVar4;
  VkShaderModule *out_module;
  VkBaseInStructure *base_in;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info_00;
  Hash h;
  WorkItem local_38;
  
  pVVar3 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext;
  info_00 = pVVar3;
  if (pVVar3 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0 &&
      this->module_identifier_database_iface != (DatabaseInterface *)0x0) {
    do {
      if (info_00->sType ==
          VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
      goto LAB_0012ea9d;
      ppvVar1 = &info_00->pNext;
      info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1;
    } while ((VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1 !=
             (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0);
  }
  info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0012ea9d:
  out_module = &info->module;
  if (info->module == (VkShaderModule)0x0) {
    for (; pVVar3 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        pVVar3 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)pVVar3->pNext) {
      if (pVVar3->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
        local_38.custom_hash = 0;
        local_38._0_8_ = (VkShaderModule)0x0;
        local_38.handle = 0;
        local_38.create_info = pVVar3;
        pVVar4 = (VkShaderModule)record_shader_module(this,&local_38,true);
        *out_module = pVVar4;
        goto LAB_0012eb22;
      }
    }
    if (info_00 == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      return false;
    }
    local_38._0_8_ = (VkShaderModule)0x0;
    bVar2 = get_hash_for_shader_module(this,info_00,(Hash *)&local_38);
    if (!bVar2) {
      return false;
    }
    *out_module = (VkShaderModule)local_38._0_8_;
    register_on_use(this,RESOURCE_SHADER_MODULE,local_38._0_8_);
  }
  else {
    bVar2 = remap_shader_module_handle(this,info->module,out_module);
    if (!bVar2) {
      return false;
    }
LAB_0012eb22:
    if (info_00 == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      return true;
    }
  }
  register_module_identifier(this,*out_module,info_00);
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkPipelineShaderStageCreateInfo &info)
{
	const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier = nullptr;
	if (module_identifier_database_iface)
	{
		identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, info.pNext);
	}

	if (info.module != VK_NULL_HANDLE)
	{
		if (!remap_shader_module_handle(info.module, &info.module))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, info.pNext))
	{
		WorkItem record_item = {};
		record_item.create_info = const_cast<VkShaderModuleCreateInfo *>(module);
		Hash h = record_shader_module(record_item, true);
		info.module = api_object_cast<VkShaderModule>(h);
	}
	else if (identifier)
	{
		Hash h = 0;
		if (!get_hash_for_shader_module(identifier, &h))
			return false;
		info.module = api_object_cast<VkShaderModule>(h);
		register_on_use(RESOURCE_SHADER_MODULE, h);
	}
	else
		return false;

	if (identifier)
		register_module_identifier(info.module, *identifier);

	return true;
}